

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int arkSetStabilityFn(void *arkode_mem,ARKExpStabFn EStab,void *estab_data)

{
  int iVar1;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem local_20;
  ARKodeHAdaptMem local_18;
  
  iVar1 = arkAccessHAdaptMem(arkode_mem,"arkSetStabilityFn",&local_20,&local_18);
  if (iVar1 == 0) {
    if (EStab == (ARKExpStabFn)0x0) {
      local_18->expstab = arkExpStab;
      estab_data = local_20;
    }
    else {
      local_18->expstab = EStab;
    }
    local_18->estab_data = estab_data;
  }
  return iVar1;
}

Assistant:

int arkSetStabilityFn(void *arkode_mem, ARKExpStabFn EStab, void *estab_data)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, "arkSetStabilityFn",
                              &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* NULL argument sets default, otherwise set inputs */
  if (EStab == NULL) {
    hadapt_mem->expstab    = arkExpStab;
    hadapt_mem->estab_data = ark_mem;
  } else {
    hadapt_mem->expstab    = EStab;
    hadapt_mem->estab_data = estab_data;
  }

  return(ARK_SUCCESS);
}